

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCRef * NULLC::ReplaceObject(NULLCRef l,NULLCRef r)

{
  void *__dest;
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  FastVector<char,_false,_false> *pFVar4;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  
  if (in_stack_00000008 == l.ptr._4_4_) {
    __dest = (void *)CONCAT44(l.typeID,in_stack_0000000c);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),l.ptr._4_4_);
    memcpy(__dest,(void *)CONCAT44(r.typeID,in_stack_0000001c),(ulong)pEVar1->size);
    *(ulong *)in_RDI = CONCAT44(in_stack_0000000c,in_stack_00000008);
    *(long *)((long)&in_RDI->ptr + 4) = l._0_8_;
  }
  else {
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),l.ptr._4_4_);
    pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
    nullcThrowError("ERROR: cannot convert from %s ref to %s ref",pcVar2,pcVar3);
    *(ulong *)in_RDI = CONCAT44(in_stack_0000000c,in_stack_00000008);
    *(long *)((long)&in_RDI->ptr + 4) = l._0_8_;
  }
  return in_RDI;
}

Assistant:

NULLCRef NULLC::ReplaceObject(NULLCRef l, NULLCRef r)
{
	if(l.typeID != r.typeID)
	{
		nullcThrowError("ERROR: cannot convert from %s ref to %s ref", &linker->exSymbols[linker->exTypes[r.typeID].offsetToName], &linker->exSymbols[linker->exTypes[l.typeID].offsetToName]);
		return l;
	}
	memcpy(l.ptr, r.ptr, linker->exTypes[r.typeID].size);
	return l;
}